

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3Utf16to8(sqlite3 *db,void *z,int nByte,u8 enc)

{
  Mem local_48;
  
  local_48.xDel = (_func_void_void_ptr *)0x0;
  local_48.zMalloc = (char *)0x0;
  local_48.u.i = 0;
  local_48.n = 0;
  local_48.flags = 0;
  local_48.type = '\0';
  local_48.enc = '\0';
  local_48.z = (char *)0x0;
  local_48.r = 0.0;
  local_48.db = db;
  sqlite3VdbeMemSetStr(&local_48,(char *)z,nByte,'\x02',(_func_void_void_ptr *)0x0);
  sqlite3VdbeChangeEncoding(&local_48,1);
  if (db->mallocFailed != '\0') {
    sqlite3VdbeMemRelease(&local_48);
    local_48.z = (char *)0x0;
  }
  return local_48.z;
}

Assistant:

SQLITE_PRIVATE char *sqlite3Utf16to8(sqlite3 *db, const void *z, int nByte, u8 enc){
  Mem m;
  memset(&m, 0, sizeof(m));
  m.db = db;
  sqlite3VdbeMemSetStr(&m, z, nByte, enc, SQLITE_STATIC);
  sqlite3VdbeChangeEncoding(&m, SQLITE_UTF8);
  if( db->mallocFailed ){
    sqlite3VdbeMemRelease(&m);
    m.z = 0;
  }
  assert( (m.flags & MEM_Term)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Str)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Dyn)!=0 || db->mallocFailed );
  assert( m.z || db->mallocFailed );
  return m.z;
}